

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_json.c
# Opt level: O0

void json_add_double(json_t *json,char *key,double value)

{
  int iVar1;
  size_t len_00;
  size_t len;
  char buffer [512];
  double value_local;
  char *key_local;
  json_t *json_local;
  
  json_check_comma(json);
  iVar1 = snprintf((char *)&len,0x200,"%f",value);
  if (key != (char *)0x0) {
    len_00 = strlen(key);
    json_write_raw(json,key,len_00,true,true);
    json_write_raw(json,":",1,false,false);
  }
  json_write_raw(json,(char *)&len,(long)iVar1,false,key == (char *)0x0);
  return;
}

Assistant:

void json_add_double (json_t *json, const char *key, double value) {
    json_check_comma(json);
    
    char buffer[512];
    // was %g but we don't like scientific notation nor the missing .0 in case of float number with no decimals
    size_t len = snprintf(buffer, sizeof(buffer), "%f", value);

    if (key) {
        json_write_raw (json, key, strlen(key), true, true);
        JSON_WRITE_COLUMN;
    }
    
    json_write_raw(json, buffer, len, false, (key == NULL));
}